

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::ProjectionLight,pbrt::Transform&,pbrt::MediumHandle&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,float&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,ProjectionLight *p,Transform *args,
          MediumHandle *args_1,Image *args_2,RGBColorSpace **args_3,float *args_4,float *args_5,
          float *args_6,polymorphic_allocator<std::byte> *args_7)

{
  MediumInterface local_158;
  Image local_148;
  
  local_158.inside =
       (MediumHandle)
       (args_1->
       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
       ).bits;
  local_158.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = local_158.inside.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  pbrt::Image::Image(&local_148,args_2);
  pbrt::ProjectionLight::ProjectionLight
            (p,args,&local_158,&local_148,*args_3,*args_4,*args_5,*args_6,args_7->memoryResource);
  pbrt::Image::~Image(&local_148);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }